

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_32x64_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  ushort uVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  ushort uVar30;
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  unkuint9 Var34;
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [16];
  long lVar44;
  int iVar45;
  undefined1 auVar46 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  short sVar63;
  short sVar66;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  short sVar98;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  undefined1 auVar99 [16];
  short sVar106;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  short sVar69;
  short sVar92;
  
  auVar64 = *(undefined1 (*) [16])above;
  auVar62 = *(undefined1 (*) [16])(above + 0x10);
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar64._0_13_;
  auVar17[0xe] = auVar64[7];
  auVar19[0xc] = auVar64[6];
  auVar19._0_12_ = auVar64._0_12_;
  auVar19._13_2_ = auVar17._13_2_;
  auVar22[0xb] = 0;
  auVar22._0_11_ = auVar64._0_11_;
  auVar22._12_3_ = auVar19._12_3_;
  auVar24[10] = auVar64[5];
  auVar24._0_10_ = auVar64._0_10_;
  auVar24._11_4_ = auVar22._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar64._0_9_;
  auVar26._10_5_ = auVar24._10_5_;
  auVar28[8] = auVar64[4];
  auVar28._0_8_ = auVar64._0_8_;
  auVar28._9_6_ = auVar26._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar28._8_7_;
  Var34 = CONCAT81(SUB158(auVar33 << 0x40,7),auVar64[3]);
  auVar39._9_6_ = 0;
  auVar39._0_9_ = Var34;
  auVar35._1_10_ = SUB1510(auVar39 << 0x30,5);
  auVar35[0] = auVar64[2];
  auVar40._11_4_ = 0;
  auVar40._0_11_ = auVar35;
  auVar31[2] = auVar64[1];
  auVar31._0_2_ = auVar64._0_2_;
  auVar31._3_12_ = SUB1512(auVar40 << 0x20,3);
  auVar67._0_2_ = auVar64._0_2_ & 0xff;
  auVar67._2_13_ = auVar31._2_13_;
  auVar67[0xf] = 0;
  auVar46._0_2_ = CONCAT11(0,auVar64[8]);
  bVar47 = auVar64[9];
  auVar46[2] = bVar47;
  auVar46[3] = 0;
  bVar48 = auVar64[10];
  auVar46[4] = bVar48;
  auVar46[5] = 0;
  bVar49 = auVar64[0xb];
  auVar46[6] = bVar49;
  auVar46[7] = 0;
  bVar50 = auVar64[0xc];
  auVar46[8] = bVar50;
  auVar46[9] = 0;
  bVar51 = auVar64[0xd];
  auVar46[10] = bVar51;
  auVar46[0xb] = 0;
  bVar52 = auVar64[0xe];
  auVar46[0xc] = bVar52;
  auVar46[0xd] = 0;
  bVar53 = auVar64[0xf];
  auVar46[0xe] = bVar53;
  auVar46[0xf] = 0;
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar62._0_13_;
  auVar18[0xe] = auVar62[7];
  uVar20 = auVar18._13_2_;
  auVar21[0xc] = auVar62[6];
  auVar21._0_12_ = auVar62._0_12_;
  auVar21._13_2_ = uVar20;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar62._0_11_;
  auVar23._12_3_ = auVar21._12_3_;
  auVar25[10] = auVar62[5];
  auVar25._0_10_ = auVar62._0_10_;
  auVar25._11_4_ = auVar23._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar62._0_9_;
  auVar27._10_5_ = auVar25._10_5_;
  auVar29[8] = auVar62[4];
  auVar29._0_8_ = auVar62._0_8_;
  auVar29._9_6_ = auVar27._9_6_;
  auVar36._7_8_ = 0;
  auVar36._0_7_ = auVar29._8_7_;
  Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),auVar62[3]);
  auVar41._9_6_ = 0;
  auVar41._0_9_ = Var37;
  auVar38._1_10_ = SUB1510(auVar41 << 0x30,5);
  auVar38[0] = auVar62[2];
  auVar42._11_4_ = 0;
  auVar42._0_11_ = auVar38;
  auVar32[2] = auVar62[1];
  auVar32._0_2_ = auVar62._0_2_;
  auVar32._3_12_ = SUB1512(auVar42 << 0x20,3);
  auVar88._0_2_ = auVar62._0_2_ & 0xff;
  auVar88._2_13_ = auVar32._2_13_;
  auVar88[0xf] = 0;
  auVar54._0_2_ = CONCAT11(0,auVar62[8]);
  bVar55 = auVar62[9];
  auVar54[2] = bVar55;
  auVar54[3] = 0;
  bVar56 = auVar62[10];
  auVar54[4] = bVar56;
  auVar54[5] = 0;
  bVar57 = auVar62[0xb];
  auVar54[6] = bVar57;
  auVar54[7] = 0;
  bVar58 = auVar62[0xc];
  auVar54[8] = bVar58;
  auVar54[9] = 0;
  bVar59 = auVar62[0xd];
  auVar54[10] = bVar59;
  auVar54[0xb] = 0;
  bVar60 = auVar62[0xe];
  auVar54[0xc] = bVar60;
  auVar54[0xd] = 0;
  bVar61 = auVar62[0xf];
  auVar54[0xe] = bVar61;
  auVar54[0xf] = 0;
  auVar64 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar65._0_4_ = auVar64._0_4_;
  auVar65._4_4_ = auVar65._0_4_;
  auVar65._8_4_ = auVar65._0_4_;
  auVar65._12_4_ = auVar65._0_4_;
  sVar63 = auVar64._0_2_;
  auVar68._0_2_ = auVar67._0_2_ - sVar63;
  sVar66 = auVar64._2_2_;
  auVar68._2_2_ = auVar31._2_2_ - sVar66;
  auVar68._4_2_ = auVar35._0_2_ - sVar63;
  sVar69 = (short)Var34;
  auVar68._6_2_ = sVar69 - sVar66;
  auVar68._8_2_ = auVar28._8_2_ - sVar63;
  auVar68._10_2_ = auVar24._10_2_ - sVar66;
  uVar30 = auVar17._13_2_ >> 8;
  auVar68._12_2_ = auVar19._12_2_ - sVar63;
  auVar68._14_2_ = uVar30 - sVar66;
  auVar64 = pabsw(in_XMM1,auVar68);
  auVar62._0_2_ = auVar46._0_2_ - sVar63;
  auVar62._2_2_ = (ushort)bVar47 - sVar66;
  auVar62._4_2_ = (ushort)bVar48 - sVar63;
  auVar62._6_2_ = (ushort)bVar49 - sVar66;
  auVar62._8_2_ = (ushort)bVar50 - sVar63;
  auVar62._10_2_ = (ushort)bVar51 - sVar66;
  auVar62._12_2_ = (ushort)bVar52 - sVar63;
  auVar62._14_2_ = (ushort)bVar53 - sVar66;
  auVar94 = pabsw(in_XMM14,auVar62);
  auVar89._0_2_ = auVar88._0_2_ - sVar63;
  auVar89._2_2_ = auVar32._2_2_ - sVar66;
  auVar89._4_2_ = auVar38._0_2_ - sVar63;
  sVar92 = (short)Var37;
  auVar89._6_2_ = sVar92 - sVar66;
  auVar89._8_2_ = auVar29._8_2_ - sVar63;
  auVar89._10_2_ = auVar25._10_2_ - sVar66;
  auVar89._12_2_ = auVar21._12_2_ - sVar63;
  auVar89._14_2_ = (uVar20 >> 8) - sVar66;
  auVar70 = pabsw(in_XMM6,auVar89);
  auVar71._0_2_ = auVar54._0_2_ - sVar63;
  auVar71._2_2_ = (ushort)bVar55 - sVar66;
  auVar71._4_2_ = (ushort)bVar56 - sVar63;
  auVar71._6_2_ = (ushort)bVar57 - sVar66;
  auVar71._8_2_ = (ushort)bVar58 - sVar63;
  auVar71._10_2_ = (ushort)bVar59 - sVar66;
  auVar71._12_2_ = (ushort)bVar60 - sVar63;
  auVar71._14_2_ = (ushort)bVar61 - sVar66;
  auVar72 = pabsw(auVar71,auVar71);
  lVar44 = 0;
  do {
    auVar43 = *(undefined1 (*) [16])(left + lVar44 * 0x10);
    iVar45 = 0x10;
    auVar93 = _DAT_004db9a0;
    do {
      auVar99 = pshufb(auVar43,auVar93);
      sVar98 = auVar99._0_2_;
      sVar100 = auVar99._2_2_;
      sVar101 = auVar99._4_2_;
      sVar102 = auVar99._6_2_;
      sVar103 = auVar99._8_2_;
      sVar104 = auVar99._10_2_;
      sVar105 = auVar99._12_2_;
      sVar106 = auVar99._14_2_;
      auVar79._0_2_ = (auVar68._0_2_ + sVar98) - auVar67._0_2_;
      auVar79._2_2_ = (auVar68._2_2_ + sVar100) - auVar31._2_2_;
      auVar79._4_2_ = (auVar68._4_2_ + sVar101) - auVar35._0_2_;
      auVar79._6_2_ = (auVar68._6_2_ + sVar102) - sVar69;
      auVar79._8_2_ = (auVar68._8_2_ + sVar103) - auVar28._8_2_;
      auVar79._10_2_ = (auVar68._10_2_ + sVar104) - auVar24._10_2_;
      auVar79._12_2_ = (auVar68._12_2_ + sVar105) - auVar19._12_2_;
      auVar79._14_2_ = (auVar68._14_2_ + sVar106) - uVar30;
      auVar85 = pabsw(in_XMM10,auVar79);
      auVar77._0_2_ = (auVar68._0_2_ + sVar98) - sVar63;
      auVar77._2_2_ = (auVar68._2_2_ + sVar100) - sVar66;
      auVar77._4_2_ = (auVar68._4_2_ + sVar101) - sVar63;
      auVar77._6_2_ = (auVar68._6_2_ + sVar102) - sVar66;
      auVar77._8_2_ = (auVar68._8_2_ + sVar103) - sVar63;
      auVar77._10_2_ = (auVar68._10_2_ + sVar104) - sVar66;
      auVar77._12_2_ = (auVar68._12_2_ + sVar105) - sVar63;
      auVar77._14_2_ = (auVar68._14_2_ + sVar106) - sVar66;
      auVar80 = pabsw(auVar79,auVar77);
      auVar83._0_2_ = -(ushort)(auVar85._0_2_ < auVar64._0_2_);
      auVar83._2_2_ = -(ushort)(auVar85._2_2_ < auVar64._2_2_);
      auVar83._4_2_ = -(ushort)(auVar85._4_2_ < auVar64._4_2_);
      auVar83._6_2_ = -(ushort)(auVar85._6_2_ < auVar64._6_2_);
      auVar83._8_2_ = -(ushort)(auVar85._8_2_ < auVar64._8_2_);
      auVar83._10_2_ = -(ushort)(auVar85._10_2_ < auVar64._10_2_);
      auVar83._12_2_ = -(ushort)(auVar85._12_2_ < auVar64._12_2_);
      auVar83._14_2_ = -(ushort)(auVar85._14_2_ < auVar64._14_2_);
      auVar96._0_2_ = -(ushort)(auVar80._0_2_ < auVar64._0_2_);
      auVar96._2_2_ = -(ushort)(auVar80._2_2_ < auVar64._2_2_);
      auVar96._4_2_ = -(ushort)(auVar80._4_2_ < auVar64._4_2_);
      auVar96._6_2_ = -(ushort)(auVar80._6_2_ < auVar64._6_2_);
      auVar96._8_2_ = -(ushort)(auVar80._8_2_ < auVar64._8_2_);
      auVar96._10_2_ = -(ushort)(auVar80._10_2_ < auVar64._10_2_);
      auVar96._12_2_ = -(ushort)(auVar80._12_2_ < auVar64._12_2_);
      auVar96._14_2_ = -(ushort)(auVar80._14_2_ < auVar64._14_2_);
      auVar86._0_2_ = -(ushort)(auVar80._0_2_ < auVar85._0_2_);
      auVar86._2_2_ = -(ushort)(auVar80._2_2_ < auVar85._2_2_);
      auVar86._4_2_ = -(ushort)(auVar80._4_2_ < auVar85._4_2_);
      auVar86._6_2_ = -(ushort)(auVar80._6_2_ < auVar85._6_2_);
      auVar86._8_2_ = -(ushort)(auVar80._8_2_ < auVar85._8_2_);
      auVar86._10_2_ = -(ushort)(auVar80._10_2_ < auVar85._10_2_);
      auVar86._12_2_ = -(ushort)(auVar80._12_2_ < auVar85._12_2_);
      auVar86._14_2_ = -(ushort)(auVar80._14_2_ < auVar85._14_2_);
      auVar81._0_2_ = (auVar62._0_2_ + sVar98) - auVar46._0_2_;
      auVar81._2_2_ = (auVar62._2_2_ + sVar100) - (ushort)bVar47;
      auVar81._4_2_ = (auVar62._4_2_ + sVar101) - (ushort)bVar48;
      auVar81._6_2_ = (auVar62._6_2_ + sVar102) - (ushort)bVar49;
      auVar81._8_2_ = (auVar62._8_2_ + sVar103) - (ushort)bVar50;
      auVar81._10_2_ = (auVar62._10_2_ + sVar104) - (ushort)bVar51;
      auVar81._12_2_ = (auVar62._12_2_ + sVar105) - (ushort)bVar52;
      auVar81._14_2_ = (auVar62._14_2_ + sVar106) - (ushort)bVar53;
      auVar85 = pabsw(auVar81,auVar81);
      auVar80._0_2_ = (auVar62._0_2_ + sVar98) - sVar63;
      auVar80._2_2_ = (auVar62._2_2_ + sVar100) - sVar66;
      auVar80._4_2_ = (auVar62._4_2_ + sVar101) - sVar63;
      auVar80._6_2_ = (auVar62._6_2_ + sVar102) - sVar66;
      auVar80._8_2_ = (auVar62._8_2_ + sVar103) - sVar63;
      auVar80._10_2_ = (auVar62._10_2_ + sVar104) - sVar66;
      auVar80._12_2_ = (auVar62._12_2_ + sVar105) - sVar63;
      auVar80._14_2_ = (auVar62._14_2_ + sVar106) - sVar66;
      auVar80 = pabsw(auVar80,auVar80);
      auVar73._0_2_ = -(ushort)(auVar85._0_2_ < auVar94._0_2_);
      auVar73._2_2_ = -(ushort)(auVar85._2_2_ < auVar94._2_2_);
      auVar73._4_2_ = -(ushort)(auVar85._4_2_ < auVar94._4_2_);
      auVar73._6_2_ = -(ushort)(auVar85._6_2_ < auVar94._6_2_);
      auVar73._8_2_ = -(ushort)(auVar85._8_2_ < auVar94._8_2_);
      auVar73._10_2_ = -(ushort)(auVar85._10_2_ < auVar94._10_2_);
      auVar73._12_2_ = -(ushort)(auVar85._12_2_ < auVar94._12_2_);
      auVar73._14_2_ = -(ushort)(auVar85._14_2_ < auVar94._14_2_);
      auVar95._0_2_ = -(ushort)(auVar80._0_2_ < auVar94._0_2_);
      auVar95._2_2_ = -(ushort)(auVar80._2_2_ < auVar94._2_2_);
      auVar95._4_2_ = -(ushort)(auVar80._4_2_ < auVar94._4_2_);
      auVar95._6_2_ = -(ushort)(auVar80._6_2_ < auVar94._6_2_);
      auVar95._8_2_ = -(ushort)(auVar80._8_2_ < auVar94._8_2_);
      auVar95._10_2_ = -(ushort)(auVar80._10_2_ < auVar94._10_2_);
      auVar95._12_2_ = -(ushort)(auVar80._12_2_ < auVar94._12_2_);
      auVar95._14_2_ = -(ushort)(auVar80._14_2_ < auVar94._14_2_);
      auVar82._0_2_ = -(ushort)(auVar80._0_2_ < auVar85._0_2_);
      auVar82._2_2_ = -(ushort)(auVar80._2_2_ < auVar85._2_2_);
      auVar82._4_2_ = -(ushort)(auVar80._4_2_ < auVar85._4_2_);
      auVar82._6_2_ = -(ushort)(auVar80._6_2_ < auVar85._6_2_);
      auVar82._8_2_ = -(ushort)(auVar80._8_2_ < auVar85._8_2_);
      auVar82._10_2_ = -(ushort)(auVar80._10_2_ < auVar85._10_2_);
      auVar82._12_2_ = -(ushort)(auVar80._12_2_ < auVar85._12_2_);
      auVar82._14_2_ = -(ushort)(auVar80._14_2_ < auVar85._14_2_);
      auVar80 = ~(auVar96 | auVar83) & auVar99 |
                (~auVar86 & auVar67 | auVar65 & auVar86) & (auVar96 | auVar83);
      auVar83 = (~auVar82 & auVar46 | auVar65 & auVar82) & (auVar95 | auVar73);
      auVar96 = ~(auVar95 | auVar73) & auVar99 | auVar83;
      sVar1 = auVar80._0_2_;
      sVar2 = auVar80._2_2_;
      sVar3 = auVar80._4_2_;
      sVar4 = auVar80._6_2_;
      sVar5 = auVar80._8_2_;
      sVar6 = auVar80._10_2_;
      sVar7 = auVar80._12_2_;
      sVar8 = auVar80._14_2_;
      sVar9 = auVar96._0_2_;
      sVar10 = auVar96._2_2_;
      sVar11 = auVar96._4_2_;
      sVar12 = auVar96._6_2_;
      sVar13 = auVar96._8_2_;
      sVar14 = auVar96._10_2_;
      sVar15 = auVar96._12_2_;
      sVar16 = auVar96._14_2_;
      auVar74._0_2_ = (auVar89._0_2_ + sVar98) - auVar88._0_2_;
      auVar74._2_2_ = (auVar89._2_2_ + sVar100) - auVar32._2_2_;
      auVar74._4_2_ = (auVar89._4_2_ + sVar101) - auVar38._0_2_;
      auVar74._6_2_ = (auVar89._6_2_ + sVar102) - sVar92;
      auVar74._8_2_ = (auVar89._8_2_ + sVar103) - auVar29._8_2_;
      auVar74._10_2_ = (auVar89._10_2_ + sVar104) - auVar25._10_2_;
      auVar74._12_2_ = (auVar89._12_2_ + sVar105) - auVar21._12_2_;
      auVar74._14_2_ = (auVar89._14_2_ + sVar106) - (uVar20 >> 8);
      auVar85 = pabsw(auVar83,auVar74);
      auVar90._0_2_ = (auVar89._0_2_ + sVar98) - sVar63;
      auVar90._2_2_ = (auVar89._2_2_ + sVar100) - sVar66;
      auVar90._4_2_ = (auVar89._4_2_ + sVar101) - sVar63;
      auVar90._6_2_ = (auVar89._6_2_ + sVar102) - sVar66;
      auVar90._8_2_ = (auVar89._8_2_ + sVar103) - sVar63;
      auVar90._10_2_ = (auVar89._10_2_ + sVar104) - sVar66;
      auVar90._12_2_ = (auVar89._12_2_ + sVar105) - sVar63;
      auVar90._14_2_ = (auVar89._14_2_ + sVar106) - sVar66;
      auVar83 = pabsw(auVar65 & auVar82,auVar90);
      local_48 = auVar70._0_2_;
      sStack_46 = auVar70._2_2_;
      sStack_44 = auVar70._4_2_;
      sStack_42 = auVar70._6_2_;
      sStack_40 = auVar70._8_2_;
      sStack_3e = auVar70._10_2_;
      sStack_3c = auVar70._12_2_;
      sStack_3a = auVar70._14_2_;
      auVar75._0_2_ = -(ushort)(auVar85._0_2_ < local_48);
      auVar75._2_2_ = -(ushort)(auVar85._2_2_ < sStack_46);
      auVar75._4_2_ = -(ushort)(auVar85._4_2_ < sStack_44);
      auVar75._6_2_ = -(ushort)(auVar85._6_2_ < sStack_42);
      auVar75._8_2_ = -(ushort)(auVar85._8_2_ < sStack_40);
      auVar75._10_2_ = -(ushort)(auVar85._10_2_ < sStack_3e);
      auVar75._12_2_ = -(ushort)(auVar85._12_2_ < sStack_3c);
      auVar75._14_2_ = -(ushort)(auVar85._14_2_ < sStack_3a);
      auVar87._0_2_ = -(ushort)(auVar83._0_2_ < local_48);
      auVar87._2_2_ = -(ushort)(auVar83._2_2_ < sStack_46);
      auVar87._4_2_ = -(ushort)(auVar83._4_2_ < sStack_44);
      auVar87._6_2_ = -(ushort)(auVar83._6_2_ < sStack_42);
      auVar87._8_2_ = -(ushort)(auVar83._8_2_ < sStack_40);
      auVar87._10_2_ = -(ushort)(auVar83._10_2_ < sStack_3e);
      auVar87._12_2_ = -(ushort)(auVar83._12_2_ < sStack_3c);
      auVar87._14_2_ = -(ushort)(auVar83._14_2_ < sStack_3a);
      auVar84._0_2_ = -(ushort)(auVar83._0_2_ < auVar85._0_2_);
      auVar84._2_2_ = -(ushort)(auVar83._2_2_ < auVar85._2_2_);
      auVar84._4_2_ = -(ushort)(auVar83._4_2_ < auVar85._4_2_);
      auVar84._6_2_ = -(ushort)(auVar83._6_2_ < auVar85._6_2_);
      auVar84._8_2_ = -(ushort)(auVar83._8_2_ < auVar85._8_2_);
      auVar84._10_2_ = -(ushort)(auVar83._10_2_ < auVar85._10_2_);
      auVar84._12_2_ = -(ushort)(auVar83._12_2_ < auVar85._12_2_);
      auVar84._14_2_ = -(ushort)(auVar83._14_2_ < auVar85._14_2_);
      auVar76._0_2_ = (auVar71._0_2_ + sVar98) - auVar54._0_2_;
      auVar76._2_2_ = (auVar71._2_2_ + sVar100) - (ushort)bVar55;
      auVar76._4_2_ = (auVar71._4_2_ + sVar101) - (ushort)bVar56;
      auVar76._6_2_ = (auVar71._6_2_ + sVar102) - (ushort)bVar57;
      auVar76._8_2_ = (auVar71._8_2_ + sVar103) - (ushort)bVar58;
      auVar76._10_2_ = (auVar71._10_2_ + sVar104) - (ushort)bVar59;
      auVar76._12_2_ = (auVar71._12_2_ + sVar105) - (ushort)bVar60;
      auVar76._14_2_ = (auVar71._14_2_ + sVar106) - (ushort)bVar61;
      auVar77 = pabsw(auVar76,auVar76);
      auVar85._0_2_ = (auVar71._0_2_ + sVar98) - sVar63;
      auVar85._2_2_ = (auVar71._2_2_ + sVar100) - sVar66;
      auVar85._4_2_ = (auVar71._4_2_ + sVar101) - sVar63;
      auVar85._6_2_ = (auVar71._6_2_ + sVar102) - sVar66;
      auVar85._8_2_ = (auVar71._8_2_ + sVar103) - sVar63;
      auVar85._10_2_ = (auVar71._10_2_ + sVar104) - sVar66;
      auVar85._12_2_ = (auVar71._12_2_ + sVar105) - sVar63;
      auVar85._14_2_ = (auVar71._14_2_ + sVar106) - sVar66;
      auVar83 = pabsw(auVar85,auVar85);
      local_68 = auVar72._0_2_;
      sStack_66 = auVar72._2_2_;
      sStack_64 = auVar72._4_2_;
      sStack_62 = auVar72._6_2_;
      sStack_60 = auVar72._8_2_;
      sStack_5e = auVar72._10_2_;
      sStack_5c = auVar72._12_2_;
      sStack_5a = auVar72._14_2_;
      auVar97._0_2_ = -(ushort)(auVar77._0_2_ < local_68);
      auVar97._2_2_ = -(ushort)(auVar77._2_2_ < sStack_66);
      auVar97._4_2_ = -(ushort)(auVar77._4_2_ < sStack_64);
      auVar97._6_2_ = -(ushort)(auVar77._6_2_ < sStack_62);
      auVar97._8_2_ = -(ushort)(auVar77._8_2_ < sStack_60);
      auVar97._10_2_ = -(ushort)(auVar77._10_2_ < sStack_5e);
      auVar97._12_2_ = -(ushort)(auVar77._12_2_ < sStack_5c);
      auVar97._14_2_ = -(ushort)(auVar77._14_2_ < sStack_5a);
      auVar91._0_2_ = -(ushort)(auVar83._0_2_ < local_68);
      auVar91._2_2_ = -(ushort)(auVar83._2_2_ < sStack_66);
      auVar91._4_2_ = -(ushort)(auVar83._4_2_ < sStack_64);
      auVar91._6_2_ = -(ushort)(auVar83._6_2_ < sStack_62);
      auVar91._8_2_ = -(ushort)(auVar83._8_2_ < sStack_60);
      auVar91._10_2_ = -(ushort)(auVar83._10_2_ < sStack_5e);
      auVar91._12_2_ = -(ushort)(auVar83._12_2_ < sStack_5c);
      auVar91._14_2_ = -(ushort)(auVar83._14_2_ < sStack_5a);
      auVar78._0_2_ = -(ushort)(auVar83._0_2_ < auVar77._0_2_);
      auVar78._2_2_ = -(ushort)(auVar83._2_2_ < auVar77._2_2_);
      auVar78._4_2_ = -(ushort)(auVar83._4_2_ < auVar77._4_2_);
      auVar78._6_2_ = -(ushort)(auVar83._6_2_ < auVar77._6_2_);
      auVar78._8_2_ = -(ushort)(auVar83._8_2_ < auVar77._8_2_);
      auVar78._10_2_ = -(ushort)(auVar83._10_2_ < auVar77._10_2_);
      auVar78._12_2_ = -(ushort)(auVar83._12_2_ < auVar77._12_2_);
      auVar78._14_2_ = -(ushort)(auVar83._14_2_ < auVar77._14_2_);
      auVar83 = ~(auVar87 | auVar75) & auVar99 |
                (~auVar84 & auVar88 | auVar65 & auVar84) & (auVar87 | auVar75);
      auVar85 = ~(auVar91 | auVar97) & auVar99 |
                (~auVar78 & auVar54 | auVar65 & auVar78) & (auVar91 | auVar97);
      sVar98 = auVar83._0_2_;
      sVar100 = auVar83._2_2_;
      in_XMM10[1] = (0 < sVar100) * (sVar100 < 0x100) * auVar83[2] - (0xff < sVar100);
      in_XMM10[0] = (0 < sVar98) * (sVar98 < 0x100) * auVar83[0] - (0xff < sVar98);
      sVar98 = auVar83._4_2_;
      in_XMM10[2] = (0 < sVar98) * (sVar98 < 0x100) * auVar83[4] - (0xff < sVar98);
      sVar98 = auVar83._6_2_;
      in_XMM10[3] = (0 < sVar98) * (sVar98 < 0x100) * auVar83[6] - (0xff < sVar98);
      sVar98 = auVar83._8_2_;
      in_XMM10[4] = (0 < sVar98) * (sVar98 < 0x100) * auVar83[8] - (0xff < sVar98);
      sVar98 = auVar83._10_2_;
      in_XMM10[5] = (0 < sVar98) * (sVar98 < 0x100) * auVar83[10] - (0xff < sVar98);
      sVar98 = auVar83._12_2_;
      in_XMM10[6] = (0 < sVar98) * (sVar98 < 0x100) * auVar83[0xc] - (0xff < sVar98);
      sVar98 = auVar83._14_2_;
      in_XMM10[7] = (0 < sVar98) * (sVar98 < 0x100) * auVar83[0xe] - (0xff < sVar98);
      sVar98 = auVar85._0_2_;
      in_XMM10[8] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[0] - (0xff < sVar98);
      sVar98 = auVar85._2_2_;
      in_XMM10[9] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[2] - (0xff < sVar98);
      sVar98 = auVar85._4_2_;
      in_XMM10[10] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[4] - (0xff < sVar98);
      sVar98 = auVar85._6_2_;
      in_XMM10[0xb] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[6] - (0xff < sVar98);
      sVar98 = auVar85._8_2_;
      in_XMM10[0xc] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[8] - (0xff < sVar98);
      sVar98 = auVar85._10_2_;
      in_XMM10[0xd] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[10] - (0xff < sVar98);
      sVar98 = auVar85._12_2_;
      in_XMM10[0xe] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[0xc] - (0xff < sVar98);
      sVar98 = auVar85._14_2_;
      in_XMM10[0xf] = (0 < sVar98) * (sVar98 < 0x100) * auVar85[0xe] - (0xff < sVar98);
      *dst = (0 < sVar1) * (sVar1 < 0x100) * auVar80[0] - (0xff < sVar1);
      dst[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar80[2] - (0xff < sVar2);
      dst[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar80[4] - (0xff < sVar3);
      dst[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar80[6] - (0xff < sVar4);
      dst[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar80[8] - (0xff < sVar5);
      dst[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar80[10] - (0xff < sVar6);
      dst[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar80[0xc] - (0xff < sVar7);
      dst[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar80[0xe] - (0xff < sVar8);
      dst[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar96[0] - (0xff < sVar9);
      dst[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar96[2] - (0xff < sVar10);
      dst[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar96[4] - (0xff < sVar11);
      dst[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar96[6] - (0xff < sVar12);
      dst[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar96[8] - (0xff < sVar13);
      dst[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar96[10] - (0xff < sVar14);
      dst[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar96[0xc] - (0xff < sVar15);
      dst[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar96[0xe] - (0xff < sVar16);
      *(undefined1 (*) [16])(dst + 0x10) = in_XMM10;
      dst = dst + stride;
      auVar99._0_2_ = auVar93._0_2_ + 1;
      auVar99._2_2_ = auVar93._2_2_ + 1;
      auVar99._4_2_ = auVar93._4_2_ + 1;
      auVar99._6_2_ = auVar93._6_2_ + 1;
      auVar99._8_2_ = auVar93._8_2_ + 1;
      auVar99._10_2_ = auVar93._10_2_ + 1;
      auVar99._12_2_ = auVar93._12_2_ + 1;
      auVar99._14_2_ = auVar93._14_2_ + 1;
      iVar45 = iVar45 + -1;
      auVar93 = auVar99;
    } while (iVar45 != 0);
    lVar44 = lVar44 + 1;
  } while (lVar44 != 4);
  return;
}

Assistant:

void aom_paeth_predictor_32x64_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i, j;
  for (j = 0; j < 4; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      l16 = _mm_shuffle_epi8(l, rep);
      const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
      const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

      _mm_store_si128((__m128i *)dst, r32l);
      _mm_store_si128((__m128i *)(dst + 16), r32h);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}